

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  UBool *pUVar7;
  long lVar8;
  uint8_t *puVar9;
  int length_00;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint8_t *s_00;
  long lVar21;
  bool bVar22;
  OffsetList offsets;
  uint local_a4;
  uint local_a0;
  OffsetList local_70;
  UnicodeSet *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar5 = spanNotUTF8(this,s,length);
    return iVar5;
  }
  local_48 = &this->spanSet;
  local_a4 = UnicodeSet::spanUTF8(local_48,(char *)s,length,USET_SPAN_CONTAINED);
  length_00 = length - local_a4;
  if (length_00 == 0) {
    return length;
  }
  local_70.list = local_70.staticList;
  local_70.capacity = 0;
  local_70.length = 0;
  local_70.start = 0;
  if (spanCondition == USET_SPAN_CONTAINED) {
    iVar14 = this->maxLength8;
    if ((long)iVar14 < 0x11) {
      local_70.capacity = 0x10;
      local_70.length = 0;
      iVar14 = 0x10;
    }
    else {
      pUVar7 = (UBool *)uprv_malloc_63((long)iVar14);
      if (pUVar7 == (UBool *)0x0) {
        iVar14 = local_70.capacity;
      }
      else {
        local_70.capacity = iVar14;
        local_70.list = pUVar7;
      }
    }
    memset(local_70.list,0,(long)iVar14);
  }
  uVar2 = this->strings->count;
  lVar21 = 0;
  if (this->all != '\0') {
    lVar21 = (long)(int)uVar2 * 2;
  }
  local_40 = this->spanLengths + lVar21;
  local_a0 = local_a4;
  do {
    s_00 = this->utf8;
    uVar10 = length;
    if (spanCondition == USET_SPAN_CONTAINED) {
      if (0 < (int)uVar2) {
        uVar12 = 0;
        do {
          iVar14 = this->utf8Lengths[uVar12];
          lVar21 = (long)iVar14;
          if (lVar21 != 0) {
            bVar1 = local_40[uVar12];
            uVar6 = (uint)bVar1;
            if (bVar1 != 0xff) {
              if ((bVar1 == 0xfe) && (uVar6 = iVar14 - 1, (char)s_00[lVar21 + -1] < -0x40)) {
                uVar6 = utf8_back1SafeBody_63(s_00,0,uVar6);
              }
              uVar3 = local_a4;
              if ((int)uVar6 < (int)local_a4) {
                uVar3 = uVar6;
              }
              if ((int)(iVar14 - uVar3) <= length_00) {
                if ((int)local_a4 <= (int)uVar6) {
                  uVar6 = local_a4;
                }
                lVar8 = (long)(int)uVar6;
                puVar9 = s + ((int)local_a0 - lVar8);
                iVar11 = iVar14 - uVar3;
                do {
                  if (-0x41 < (char)s[(int)local_a0 - lVar8]) {
                    iVar5 = local_70.capacity;
                    if (local_70.start + iVar11 < local_70.capacity) {
                      iVar5 = 0;
                    }
                    iVar13 = (local_70.start + iVar11) - iVar5;
                    if (local_70.list[iVar13] == '\0') {
                      lVar18 = 0;
                      iVar16 = iVar14 + 1;
                      do {
                        if (puVar9[lVar18] != s_00[lVar18]) goto LAB_001a606e;
                        lVar18 = lVar18 + 1;
                        iVar16 = iVar16 + -1;
                      } while (1 < iVar16);
                      if (iVar11 == length_00) goto LAB_001a6291;
                      local_70.list[iVar13] = '\x01';
                      local_70.length = local_70.length + 1;
                    }
                  }
LAB_001a606e:
                  bVar22 = lVar8 == 0;
                  lVar8 = lVar8 + -1;
                  if (bVar22) break;
                  puVar9 = puVar9 + 1;
                  bVar22 = iVar11 != length_00;
                  iVar11 = iVar11 + 1;
                } while (bVar22);
              }
            }
            s_00 = s_00 + lVar21;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
      }
LAB_001a61ba:
      if ((local_a4 == 0) && (local_a0 != 0)) {
        if (local_70.length == 0) {
          uVar6 = UnicodeSet::spanUTF8
                            (local_48,(char *)(s + (int)local_a0),length_00,USET_SPAN_CONTAINED);
          length_00 = length_00 - uVar6;
          if ((length_00 != 0) && (local_a4 = uVar6, uVar6 != 0)) goto LAB_001a6282;
          uVar10 = uVar6 + local_a0;
LAB_001a6291:
          OffsetList::~OffsetList(&local_70);
          return uVar10;
        }
        uVar6 = spanOneUTF8(local_48,s + (int)local_a0,length_00);
        if ((int)uVar6 < 1) goto LAB_001a6233;
        length_00 = length_00 - uVar6;
        if (length_00 == 0) goto LAB_001a6291;
        iVar5 = local_70.capacity;
        if ((int)(local_70.start + uVar6) < local_70.capacity) {
          iVar5 = 0;
        }
        local_70.start = (local_70.start + uVar6) - iVar5;
        if (local_70.list[local_70.start] != '\0') {
          local_70.list[local_70.start] = '\0';
          local_70.length = local_70.length + -1;
        }
      }
      else {
        uVar10 = local_a0;
        if (local_70.length == 0) goto LAB_001a6291;
LAB_001a6233:
        uVar6 = OffsetList::popMinimum(&local_70);
        length_00 = length_00 - uVar6;
      }
      local_a4 = 0;
    }
    else {
      if ((int)uVar2 < 1) {
        bVar22 = true;
        uVar6 = 0;
      }
      else {
        local_38 = s + (int)local_a0;
        uVar12 = 0;
        uVar15 = 0;
        uVar6 = 0;
        do {
          uVar3 = this->utf8Lengths[uVar12];
          if ((long)(int)uVar3 != 0) {
            uVar19 = (uint)local_40[uVar12];
            if (0xfd < local_40[uVar12]) {
              uVar19 = uVar3;
            }
            uVar4 = local_a4;
            if ((int)uVar19 < (int)local_a4) {
              uVar4 = uVar19;
            }
            uVar17 = uVar3 - uVar4;
            if (((int)uVar17 <= length_00) && (iVar14 = (int)uVar15, iVar14 <= (int)uVar4)) {
              if ((int)local_a4 <= (int)uVar19) {
                uVar19 = local_a4;
              }
              lVar21 = (long)local_38 - (long)(int)uVar19;
              uVar20 = (long)(int)uVar19;
              do {
                if ((-0x41 < (char)s[(long)(int)local_a0 - uVar20]) &&
                   (((long)iVar14 < (long)uVar20 || ((int)uVar6 < (int)uVar17)))) {
                  lVar8 = 0;
                  iVar11 = uVar3 + 1;
                  while (*(uint8_t *)(lVar21 + lVar8) == s_00[lVar8]) {
                    lVar8 = lVar8 + 1;
                    iVar11 = iVar11 + -1;
                    if (iVar11 < 2) {
                      uVar15 = uVar20 & 0xffffffff;
                      uVar6 = uVar17;
                      goto LAB_001a6179;
                    }
                  }
                }
                if (length_00 <= (int)uVar17) break;
                uVar17 = uVar17 + 1;
                lVar21 = lVar21 + 1;
                bVar22 = (long)iVar14 < (long)uVar20;
                uVar20 = uVar20 - 1;
              } while (bVar22);
            }
LAB_001a6179:
            s_00 = s_00 + (int)uVar3;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        bVar22 = (int)uVar15 == 0;
      }
      if ((uVar6 == 0) && (bVar22)) goto LAB_001a61ba;
      local_a4 = 0;
      length_00 = length_00 - uVar6;
      if (length_00 == 0) goto LAB_001a6291;
    }
LAB_001a6282:
    local_a0 = local_a0 + uVar6;
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotUTF8(s, length);
    }
    int32_t spanLength=spanSet.spanUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    U8_BACK_1(s8, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            !offsets.containsOffset(inc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            (overlap>maxOverlap ||
                                /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.spanUTF8((const char *)s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneUTF8(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}